

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O1

void quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>
               (teamscore *start,teamscore *end,_func_bool_teamscore_ptr_teamscore_ptr *fun)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  teamscore *end_00;
  teamscore *ptVar5;
  teamscore *ptVar6;
  teamscore *ptVar7;
  teamscore *ptVar8;
  teamscore pivot;
  teamscore local_68;
  teamscore local_58;
  teamscore *local_48;
  teamscore *local_40;
  teamscore *local_38;
  
  lVar4 = (long)end - (long)start;
  do {
    if (lVar4 >> 4 < 0xb) {
      if (start + 1 < end) {
        ptVar7 = start + 1;
        ptVar5 = start;
        local_48 = end;
        do {
          ptVar8 = ptVar7;
          bVar2 = (*fun)(ptVar8,ptVar5);
          if (bVar2) {
            local_58.team._0_4_ = *(undefined4 *)&ptVar8->team;
            local_58.team._4_4_ = *(undefined4 *)((long)&ptVar8->team + 4);
            local_58.score = ptVar8->score;
            local_58._12_4_ = *(undefined4 *)&ptVar8->field_0xc;
            ptVar8->score = ptVar5->score;
            ptVar8->team = ptVar5->team;
            while (start < ptVar5) {
              ptVar7 = ptVar5 + -1;
              bVar2 = (*fun)(&local_58,ptVar7);
              if (!bVar2) break;
              ptVar5->score = ptVar5[-1].score;
              ptVar5->team = ptVar7->team;
              ptVar5 = ptVar7;
            }
            ptVar5->score = local_58.score;
            ptVar5->team = (char *)CONCAT44(local_58.team._4_4_,local_58.team._0_4_);
          }
          ptVar7 = ptVar8 + 1;
          ptVar5 = ptVar8;
        } while (ptVar8 + 1 < local_48);
      }
      return;
    }
    ptVar7 = (teamscore *)(&start->team + (lVar4 >> 4 & 0xfffffffffffffffe));
    local_40 = end;
    local_38 = start;
    bVar2 = (*fun)(start,ptVar7);
    ptVar5 = end + -1;
    if (bVar2) {
      bVar2 = (*fun)(ptVar5,start);
      if (bVar2) {
        local_68.score = start->score;
        local_68.team = start->team;
        start->score = end[-1].score;
        start->team = ptVar5->team;
        end[-1].score = ptVar7->score;
        ptVar5->team = ptVar7->team;
      }
      else {
        bVar2 = (*fun)(ptVar5,ptVar7);
        if (bVar2) {
          local_68.score = end[-1].score;
          local_68.team = ptVar5->team;
          ptVar5->team = ptVar7->team;
          iVar3 = ptVar7->score;
LAB_00145649:
          end[-1].score = iVar3;
        }
        else {
          local_68.score = ptVar7->score;
          local_68.team = ptVar7->team;
        }
      }
    }
    else {
      bVar2 = (*fun)(start,ptVar5);
      if (bVar2) {
        local_68.score = start->score;
        local_68.team = start->team;
        start->team = ptVar7->team;
        start->score = ptVar7->score;
      }
      else {
        bVar2 = (*fun)(ptVar7,ptVar5);
        if (!bVar2) {
          local_68.score = ptVar7->score;
          local_68.team = ptVar7->team;
          local_58.team._0_4_ = *(undefined4 *)&start->team;
          local_58.team._4_4_ = *(undefined4 *)((long)&start->team + 4);
          pcVar1 = start->team;
          iVar3 = start->score;
          local_58._12_4_ = *(undefined4 *)&start->field_0xc;
          start->score = end[-1].score;
          start->team = ptVar5->team;
          ptVar5->team = pcVar1;
          local_58.score = iVar3;
          goto LAB_00145649;
        }
        local_68.score = end[-1].score;
        local_68.team = ptVar5->team;
        end[-1].score = start->score;
        ptVar5->team = start->team;
        start->score = ptVar7->score;
        start->team = ptVar7->team;
      }
    }
    ptVar8 = end + -2;
    ptVar7->score = end[-2].score;
    ptVar7->team = ptVar8->team;
    ptVar5 = start + 1;
    local_48 = end;
    ptVar7 = ptVar8;
    do {
      while (end_00 = ptVar5, bVar2 = (*fun)(end_00,&local_68), !bVar2) {
        while( true ) {
          ptVar6 = ptVar7 + -1;
          bVar2 = (*fun)(&local_68,ptVar6);
          if (!bVar2) break;
          ptVar7 = ptVar6;
          if (ptVar6 <= end_00) goto LAB_001456d8;
        }
        local_58.team._0_4_ = *(undefined4 *)&end_00->team;
        local_58.team._4_4_ = *(undefined4 *)((long)&end_00->team + 4);
        pcVar1 = end_00->team;
        local_58.score = end_00->score;
        local_58._12_4_ = *(undefined4 *)&end_00->field_0xc;
        end_00->score = ptVar7[-1].score;
        end_00->team = ptVar6->team;
        ptVar6->team = pcVar1;
        ptVar7[-1].score = local_58.score;
        ptVar5 = end_00 + 1;
        ptVar7 = ptVar6;
        if (ptVar6 <= end_00 + 1) {
          end_00 = end_00 + 1;
          goto LAB_001456d8;
        }
      }
      end_00 = end_00 + 1;
      ptVar5 = end_00;
    } while (end_00 < ptVar7);
LAB_001456d8:
    end[-2].score = end_00->score;
    ptVar8->team = end_00->team;
    end_00->team = local_68.team;
    end_00->score = local_68.score;
    ptVar5 = end_00 + 1;
    if ((long)end_00 - (long)local_38 < (long)local_40 - (long)ptVar5) {
      quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>(start,end_00,fun);
      start = ptVar5;
      end_00 = local_48;
    }
    else {
      quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>(ptVar5,local_48,fun);
    }
    lVar4 = (long)end_00 - (long)start;
    end = end_00;
  } while( true );
}

Assistant:

static inline void quicksort(T *start, T *end, F fun)
{
    while(end-start > 10)
    {
        T *mid = &start[(end-start)/2], *i = start+1, *j = end-2, pivot;
        if(fun(*start, *mid)) /* start < mid */
        {
            if(fun(end[-1], *start)) { pivot = *start; *start = end[-1]; end[-1] = *mid; } /* end < start < mid */
            else if(fun(end[-1], *mid)) { pivot = end[-1]; end[-1] = *mid; } /* start <= end < mid */
            else { pivot = *mid; } /* start < mid <= end */
        }
        else if(fun(*start, end[-1])) { pivot = *start; *start = *mid; } /*mid <= start < end */
        else if(fun(*mid, end[-1])) { pivot = end[-1]; end[-1] = *start; *start = *mid; } /* mid < end <= start */
        else { pivot = *mid; swap(*start, end[-1]); }  /* end <= mid <= start */
        *mid = end[-2];
        do
        {
            while(fun(*i, pivot)) if(++i >= j) goto partitioned;
            while(fun(pivot, *--j)) if(i >= j) goto partitioned;
            swap(*i, *j);
        }
        while(++i < j);
    partitioned:
        end[-2] = *i;
        *i = pivot;
        
        if(i-start < end-(i+1))
        {
            quicksort(start, i, fun);
            start = i+1;
        }
        else
        {
            quicksort(i+1, end, fun);
            end = i;
        }
    }
    
    insertionsort(start, end, fun);
}